

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 rw::ps2::getBatchSize(MatPipeline *pipe,uint32 vertCount)

{
  uint unpack;
  uint32 uVar1;
  uint32 uVar2;
  long lVar3;
  
  if (vertCount == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 1;
    for (lVar3 = 4; lVar3 != 0xe; lVar3 = lVar3 + 1) {
      if ((pipe->attribs[lVar3 + -4] != (PipeAttribute *)0x0) &&
         (unpack = pipe->attribs[lVar3 + -4]->attrib, (unpack & 6) == 0)) {
        uVar1 = attribSize(unpack);
        uVar2 = uVar2 + (uVar1 * vertCount + 0xf >> 4) + 1;
      }
    }
  }
  return uVar2;
}

Assistant:

static uint32
getBatchSize(MatPipeline *pipe, uint32 vertCount)
{
	PipeAttribute *a;
	if(vertCount == 0)
		return 0;
	uint32 size = 1;	// ITOP &c. at the end
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]) && (a->attrib & AT_RW) == 0){
			size++;	// UNPACK &c.
			size += QWC(vertCount*attribSize(a->attrib));
		}
	return size;
}